

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O2

void * FilterRender::doFlip(void *data,uint width,uint height,bool isLR)

{
  undefined1 uVar1;
  long lVar2;
  long lVar3;
  int i;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int i_4;
  int j;
  ulong uVar10;
  ulong uVar11;
  
  uVar7 = (ulong)height;
  pvVar4 = operator_new__(uVar7 * 8);
  uVar9 = (ulong)width;
  for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
    pvVar5 = operator_new__(uVar9 * 8);
    *(void **)((long)pvVar4 + uVar11 * 8) = pvVar5;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      pvVar6 = operator_new__(4);
      *(void **)((long)pvVar5 + uVar10 * 8) = pvVar6;
    }
  }
  pvVar5 = data;
  for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
    for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        *(undefined1 *)(*(long *)(*(long *)((long)pvVar4 + uVar11 * 8) + uVar10 * 8) + lVar8) =
             *(undefined1 *)((long)pvVar5 + lVar8);
      }
      pvVar5 = (void *)((long)pvVar5 + 4);
    }
  }
  if (isLR) {
    for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
      for (uVar10 = 0; uVar10 != width >> 1; uVar10 = uVar10 + 1) {
        for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
          lVar2 = *(long *)((long)pvVar4 + uVar11 * 8);
          lVar3 = *(long *)(lVar2 + uVar10 * 8);
          lVar2 = *(long *)(lVar2 + (ulong)(width - (int)uVar10) * 8);
          uVar1 = *(undefined1 *)(lVar3 + lVar8);
          *(undefined1 *)(lVar3 + lVar8) = *(undefined1 *)(lVar2 + lVar8);
          *(undefined1 *)(lVar2 + lVar8) = uVar1;
        }
      }
    }
  }
  else {
    for (uVar11 = 0; uVar11 != height >> 1; uVar11 = uVar11 + 1) {
      for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
        for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
          lVar2 = *(long *)(*(long *)((long)pvVar4 + uVar11 * 8) + uVar10 * 8);
          lVar3 = *(long *)(*(long *)((long)pvVar4 + (ulong)(height - (int)uVar11) * 8) + uVar10 * 8
                           );
          uVar1 = *(undefined1 *)(lVar2 + lVar8);
          *(undefined1 *)(lVar2 + lVar8) = *(undefined1 *)(lVar3 + lVar8);
          *(undefined1 *)(lVar3 + lVar8) = uVar1;
        }
      }
    }
  }
  for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
    for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        *(undefined1 *)((long)data + lVar8) =
             *(undefined1 *)(*(long *)(*(long *)((long)pvVar4 + uVar11 * 8) + uVar10 * 8) + lVar8);
      }
      data = (void *)((long)data + 4);
    }
  }
  uVar11 = 0;
  do {
    if (uVar11 == uVar7) {
      operator_delete__(pvVar4);
    }
    for (uVar10 = 0; pvVar5 = *(void **)((long)pvVar4 + uVar11 * 8), uVar9 != uVar10;
        uVar10 = uVar10 + 1) {
      pvVar5 = *(void **)((long)pvVar5 + uVar10 * 8);
      if (pvVar5 != (void *)0x0) {
        operator_delete__(pvVar5);
      }
    }
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void* FilterRender::doFlip(void *data, uint width, uint height, bool isLR) {
	unsigned char ***map;

	map = new unsigned char**[height];
	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	if (isLR) {
		for (int i = 0; i < height; i++) {
			for (int j = 0; j < width / 2; j++) {
				for (int k = 0; k < 4; k++) {
					swap(map[i][j][k], map[i][width - j][k]);
				}
			}
		}
	} else {
		for (int i = 0; i < height / 2; i++) {
			for (int j = 0; j < width; j++) {
				for (int k = 0; k < 4; k++) {
					swap(map[i][j][k], map[height - i][j][k]);
				}
			}
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}